

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void set_sgb_palette(Emulator *e,int pal,u8 lo0,u8 hi0,u8 lo1,u8 hi1,u8 lo2,u8 hi2,u8 lo3,u8 hi3)

{
  RGBA RVar1;
  int local_1c;
  int i;
  u8 hi1_local;
  u8 lo1_local;
  u8 hi0_local;
  u8 lo0_local;
  int pal_local;
  Emulator *e_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    RVar1 = unpack_cgb_color8(e,lo0,hi0);
    (e->state).sgb.screen_pal[local_1c].color[0] = RVar1;
  }
  RVar1 = unpack_cgb_color8(e,lo1,hi1);
  (e->state).sgb.screen_pal[pal].color[1] = RVar1;
  RVar1 = unpack_cgb_color8(e,lo2,hi2);
  (e->state).sgb.screen_pal[pal].color[2] = RVar1;
  RVar1 = unpack_cgb_color8(e,lo3,hi3);
  (e->state).sgb.screen_pal[pal].color[3] = RVar1;
  if (pal == 0) {
    emulator_set_bw_palette(e,PALETTE_TYPE_OBP0,(e->state).sgb.screen_pal);
    emulator_set_bw_palette(e,PALETTE_TYPE_OBP1,(e->state).sgb.screen_pal);
  }
  update_bw_palette_rgba(e,PALETTE_TYPE_BGP);
  return;
}

Assistant:

static void set_sgb_palette(Emulator* e, int pal, u8 lo0, u8 hi0, u8 lo1,
                               u8 hi1, u8 lo2, u8 hi2, u8 lo3, u8 hi3) {
  for (int i = 0; i < 4; ++i) {
    SGB.screen_pal[i].color[0] = unpack_cgb_color8(e, lo0, hi0);
  }
  SGB.screen_pal[pal].color[1] = unpack_cgb_color8(e, lo1, hi1);
  SGB.screen_pal[pal].color[2] = unpack_cgb_color8(e, lo2, hi2);
  SGB.screen_pal[pal].color[3] = unpack_cgb_color8(e, lo3, hi3);
  if (pal == 0) {
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP0, &SGB.screen_pal[0]);
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP1, &SGB.screen_pal[0]);
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
}